

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

qint64 __thiscall QSslSocket::readData(QSslSocket *this,char *data,qint64 maxlen)

{
  bool bVar1;
  QSslSocketPrivate *pQVar2;
  long lVar3;
  char *in_RDX;
  QObject *in_RSI;
  qint64 readBytes;
  QSslSocketPrivate *d;
  QSslSocketPrivate *local_8;
  
  pQVar2 = d_func((QSslSocket *)0x3a4a75);
  local_8 = (QSslSocketPrivate *)0x0;
  if ((pQVar2->mode == UnencryptedMode) && ((pQVar2->autoStartHandshake & 1U) == 0)) {
    local_8 = (QSslSocketPrivate *)QIODevice::read((char *)pQVar2->plainSocket,(longlong)in_RSI);
  }
  else {
    lVar3 = (**(code **)(*(long *)&pQVar2->plainSocket->super_QAbstractSocket + 0xa0))();
    if ((lVar3 != 0) || (bVar1 = QSslSocketPrivate::hasUndecryptedData(local_8), bVar1)) {
      QMetaObject::invokeMethod<>(in_RSI,in_RDX,(ConnectionType)((ulong)pQVar2 >> 0x20));
    }
    else if (((pQVar2->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.state != ConnectedState
             ) && (local_8 = (QSslSocketPrivate *)0x0, in_RDX != (char *)0x0)) {
      local_8 = (QSslSocketPrivate *)0xffffffffffffffff;
    }
  }
  return (qint64)local_8;
}

Assistant:

qint64 QSslSocket::readData(char *data, qint64 maxlen)
{
    Q_D(QSslSocket);
    qint64 readBytes = 0;

    if (d->mode == UnencryptedMode && !d->autoStartHandshake) {
        readBytes = d->plainSocket->read(data, maxlen);
#ifdef QSSLSOCKET_DEBUG
        qCDebug(lcSsl) << "QSslSocket::readData(" << (void *)data << ',' << maxlen << ") =="
                 << readBytes;
#endif
    } else {
        // possibly trigger another transmit() to decrypt more data from the socket
        if (d->plainSocket->bytesAvailable() || d->hasUndecryptedData())
            QMetaObject::invokeMethod(this, "_q_flushReadBuffer", Qt::QueuedConnection);
        else if (d->state != QAbstractSocket::ConnectedState)
            return maxlen ? qint64(-1) : qint64(0);
    }

    return readBytes;
}